

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IndexType.H
# Opt level: O2

Long __thiscall amrex::Box::volume(Box *this)

{
  uint uVar1;
  
  uVar1 = (this->btype).itype;
  return (long)(int)(((this->bigend).vect[2] + (uint)((uVar1 & 4) == 0)) - (this->smallend).vect[2])
         * (long)(((this->bigend).vect[1] - (this->smallend).vect[1]) +
                  ((int)(uVar1 << 0x1e) >> 0x1f) + 1) *
           (long)(int)(((this->bigend).vect[0] - ((uVar1 & 1) + (this->smallend).vect[0])) + 1);
}

Assistant:

bool test (int dir) const noexcept { return (itype & mask(dir)) != 0; }